

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::inverseDynamicsWithInternalJointForceTorques
          (KinDynComputations *this,Span<const_double,__1L> baseAcc,Span<const_double,__1L> s_ddot,
          LinkNetExternalWrenches *linkExtForces,
          FreeFloatingGeneralizedTorques *baseForceAndJointTorques,
          LinkInternalWrenches *linkInternalWrenches)

{
  long lVar1;
  pointer peVar2;
  char *pcVar3;
  VectorDynSize aVStack_88 [32];
  Vector6 local_68;
  
  peVar2 = baseAcc.storage_.data_;
  if (baseAcc.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    lVar1 = iDynTree::Model::getNrOfDOFs();
    if (lVar1 == s_ddot.storage_.super_extent_type<_1L>.size_.size_) {
      local_68.m_data[0]._0_4_ = *(undefined4 *)peVar2;
      local_68.m_data[0]._4_4_ = *(undefined4 *)((long)peVar2 + 4);
      local_68.m_data[1]._0_4_ = *(undefined4 *)(peVar2 + 1);
      local_68.m_data[1]._4_4_ = *(undefined4 *)((long)peVar2 + 0xc);
      local_68.m_data[2]._0_4_ = *(undefined4 *)(peVar2 + 2);
      local_68.m_data[2]._4_4_ = *(undefined4 *)((long)peVar2 + 0x14);
      local_68.m_data[3]._0_4_ = *(undefined4 *)(peVar2 + 3);
      local_68.m_data[3]._4_4_ = *(undefined4 *)((long)peVar2 + 0x1c);
      local_68.m_data[4]._0_4_ = *(undefined4 *)(peVar2 + 4);
      local_68.m_data[4]._4_4_ = *(undefined4 *)((long)peVar2 + 0x24);
      local_68.m_data[5]._0_4_ = *(undefined4 *)(peVar2 + 5);
      local_68.m_data[5]._4_4_ = *(undefined4 *)((long)peVar2 + 0x2c);
      iDynTree::VectorDynSize::VectorDynSize
                (aVStack_88,s_ddot.storage_.super_extent_type<_1L>.size_.size_,s_ddot.storage_.data_
                );
      inverseDynamicsWithInternalJointForceTorques
                (this,&local_68,aVStack_88,linkExtForces,baseForceAndJointTorques,
                 linkInternalWrenches);
      iDynTree::VectorDynSize::~VectorDynSize(aVStack_88);
      return true;
    }
    pcVar3 = "Wrong size in input s_ddot";
  }
  else {
    pcVar3 = "Wrong size in input baseAcc";
  }
  iDynTree::reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques",pcVar3);
  return false;
}

Assistant:

bool KinDynComputations::inverseDynamicsWithInternalJointForceTorques(iDynTree::Span<const double> baseAcc,
                                                                      iDynTree::Span<const double> s_ddot,
                                                                      const LinkNetExternalWrenches & linkExtForces,
                                                                            FreeFloatingGeneralizedTorques & baseForceAndJointTorques,
                                                                            LinkInternalWrenches& linkInternalWrenches)
{
    constexpr int expected_spatial_acceleration_size = 6;
    bool ok = baseAcc.size() == expected_spatial_acceleration_size;
    if( !ok )
    {
        reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques","Wrong size in input baseAcc");
        return false;
    }

    ok = s_ddot.size() == pimpl->m_robot_model.getNrOfDOFs();
    if( !ok )
    {
        reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques","Wrong size in input s_ddot");
        return false;
    }


    return this->inverseDynamicsWithInternalJointForceTorques(Vector6(baseAcc),
                                                              VectorDynSize(s_ddot),
                                                              linkExtForces,
                                                              baseForceAndJointTorques,
                                                              linkInternalWrenches);
}